

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5CacheInstArray(Fts5Cursor *pCsr)

{
  Fts5PoslistReader *pFVar1;
  i64 iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fts5PoslistReader *pFVar6;
  u8 *puVar7;
  int *piVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long in_FS_OFFSET;
  int n;
  u8 *a;
  int local_4c;
  u8 *local_48;
  int local_3c;
  long local_38;
  long lVar15;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  uVar11 = 0;
  if (pCsr->pExpr != (Fts5Expr *)0x0) {
    uVar11 = pCsr->pExpr->nPhrase;
  }
  iVar14 = *(int *)&((pCsr->base).pVtab[1].pModule)->xDisconnect;
  pFVar6 = pCsr->aInstIter;
  if (pFVar6 == (Fts5PoslistReader *)0x0) {
    pFVar6 = (Fts5PoslistReader *)sqlite3Fts5MallocZero(&local_3c,(long)(int)uVar11 << 5);
    pCsr->aInstIter = pFVar6;
    iVar4 = local_3c;
    if (pFVar6 == (Fts5PoslistReader *)0x0) goto LAB_001ec327;
  }
  if (local_3c == 0 && 0 < (int)uVar11) {
    piVar8 = &pFVar6->i;
    uVar13 = 0;
    while( true ) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_4c = -0x55555556;
      iVar4 = fts5CsrPoslist(pCsr,(int)uVar13,&local_48,&local_4c);
      if (iVar4 != 0) break;
      ((Fts5PoslistReader *)(piVar8 + -3))->a = (u8 *)0x0;
      *(undefined8 *)(piVar8 + -1) = 0;
      *(undefined8 *)(piVar8 + 1) = 0;
      *(i64 *)(piVar8 + 3) = 0;
      ((Fts5PoslistReader *)(piVar8 + -3))->a = local_48;
      piVar8[-1] = local_4c;
      iVar4 = sqlite3Fts5PoslistNext64(local_48,local_4c,piVar8,(i64 *)(piVar8 + 3));
      if (iVar4 != 0) {
        *(u8 *)((long)piVar8 + 5) = '\x01';
      }
      uVar13 = uVar13 + 1;
      iVar4 = 0;
      if (uVar11 <= uVar13) goto LAB_001ec1b0;
      piVar8 = piVar8 + 8;
    }
    iVar14 = 0;
  }
  else {
    iVar4 = local_3c;
    if (local_3c == 0) {
LAB_001ec1b0:
      if (0 < (int)uVar11) {
        lVar10 = 0;
        do {
          uVar9 = 0xffffffff;
          uVar13 = 0;
          puVar7 = &pFVar6->bEof;
          do {
            if ((*puVar7 == '\0') &&
               (((int)uVar9 < 0 || (*(long *)(puVar7 + 7) < pFVar6[uVar9].iPos)))) {
              uVar9 = (uint)uVar13;
            }
            uVar13 = uVar13 + 1;
            puVar7 = puVar7 + 0x20;
          } while (uVar11 != uVar13);
          lVar15 = lVar10;
          if ((int)uVar9 < 0) break;
          lVar15 = lVar10 + 1;
          iVar5 = pCsr->nInstAlloc;
          piVar8 = pCsr->aInst;
          if (iVar5 <= lVar15) {
            iVar3 = iVar5 * 2;
            if (iVar5 == 0) {
              iVar3 = 0x20;
            }
            iVar5 = sqlite3_initialize();
            if ((iVar5 != 0) ||
               (piVar8 = (int *)sqlite3Realloc(piVar8,(long)iVar3 * 0xc), piVar8 == (int *)0x0)) {
              iVar4 = 7;
              iVar14 = (int)lVar10;
              goto LAB_001ec31c;
            }
            pCsr->aInst = piVar8;
            pCsr->nInstAlloc = iVar3;
          }
          lVar10 = (lVar15 * 3 << 0x20) + -0x300000000 >> 0x1e;
          *(uint *)((long)piVar8 + lVar10) = uVar9;
          iVar2 = pFVar6[uVar9].iPos;
          uVar12 = (uint)((ulong)iVar2 >> 0x20) & 0x7fffffff;
          *(uint *)((long)piVar8 + lVar10 + 4) = uVar12;
          *(uint *)((long)piVar8 + lVar10 + 8) = (uint)iVar2 & 0x7fffffff;
          if (iVar14 <= (int)uVar12) {
            iVar4 = 0x10b;
            iVar14 = (int)lVar15;
            goto LAB_001ec31c;
          }
          pFVar1 = pFVar6 + uVar9;
          iVar5 = sqlite3Fts5PoslistNext64(pFVar1->a,pFVar1->n,&pFVar1->i,&pFVar6[uVar9].iPos);
          if (iVar5 != 0) {
            pFVar1->bEof = '\x01';
          }
          lVar10 = lVar15;
        } while (0 < (int)uVar11);
        iVar14 = (int)lVar15;
        goto LAB_001ec31c;
      }
    }
    iVar14 = 0;
  }
LAB_001ec31c:
  pCsr->nInstCount = iVar14;
  *(byte *)&pCsr->csrflags = (byte)pCsr->csrflags & 0xf7;
LAB_001ec327:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5CacheInstArray(Fts5Cursor *pCsr){
  int rc = SQLITE_OK;
  Fts5PoslistReader *aIter;       /* One iterator for each phrase */
  int nIter;                      /* Number of iterators/phrases */
  int nCol = ((Fts5Table*)pCsr->base.pVtab)->pConfig->nCol;

  nIter = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  if( pCsr->aInstIter==0 ){
    sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nIter;
    pCsr->aInstIter = (Fts5PoslistReader*)sqlite3Fts5MallocZero(&rc, nByte);
  }
  aIter = pCsr->aInstIter;

  if( aIter ){
    int nInst = 0;                /* Number instances seen so far */
    int i;

    /* Initialize all iterators */
    for(i=0; i<nIter && rc==SQLITE_OK; i++){
      const u8 *a;
      int n;
      rc = fts5CsrPoslist(pCsr, i, &a, &n);
      if( rc==SQLITE_OK ){
        sqlite3Fts5PoslistReaderInit(a, n, &aIter[i]);
      }
    }

    if( rc==SQLITE_OK ){
      while( 1 ){
        int *aInst;
        int iBest = -1;
        for(i=0; i<nIter; i++){
          if( (aIter[i].bEof==0)
              && (iBest<0 || aIter[i].iPos<aIter[iBest].iPos)
            ){
            iBest = i;
          }
        }
        if( iBest<0 ) break;

        nInst++;
        if( nInst>=pCsr->nInstAlloc ){
          int nNewSize = pCsr->nInstAlloc ? pCsr->nInstAlloc*2 : 32;
          aInst = (int*)sqlite3_realloc64(
              pCsr->aInst, nNewSize*sizeof(int)*3
              );
          if( aInst ){
            pCsr->aInst = aInst;
            pCsr->nInstAlloc = nNewSize;
          }else{
            nInst--;
            rc = SQLITE_NOMEM;
            break;
          }
        }

        aInst = &pCsr->aInst[3 * (nInst-1)];
        aInst[0] = iBest;
        aInst[1] = FTS5_POS2COLUMN(aIter[iBest].iPos);
        aInst[2] = FTS5_POS2OFFSET(aIter[iBest].iPos);
        assert( aInst[1]>=0 );
        if( aInst[1]>=nCol ){
          rc = FTS5_CORRUPT;
          break;
        }
        sqlite3Fts5PoslistReaderNext(&aIter[iBest]);
      }
    }

    pCsr->nInstCount = nInst;
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_INST);
  }
  return rc;
}